

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O3

int __thiscall google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelf(UnknownFieldSet *this)

{
  size_t sVar1;
  
  sVar1 = SpaceUsedExcludingSelfLong(this);
  if ((sVar1 & 0xffffffff80000000) == 0) {
    return (int)sVar1;
  }
  SpaceUsedExcludingSelf();
}

Assistant:

int SpaceUsedExcludingSelf() const {
    return internal::ToIntSize(SpaceUsedExcludingSelfLong());
  }